

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cc
# Opt level: O2

bool __thiscall
xemmai::ast::t_block::f_forward
          (t_block *this,
          vector<xemmai::ast::t_block::t_private,_std::allocator<xemmai::ast::t_block::t_private>_>
          *a_privates)

{
  pointer ptVar1;
  bool bVar2;
  pointer ptVar3;
  pointer ptVar4;
  pointer ptVar5;
  byte bVar6;
  long lVar7;
  
  bVar2 = this->v_forward;
  if (bVar2 == false) {
    this->v_forward = true;
    std::vector<xemmai::ast::t_block::t_private,_std::allocator<xemmai::ast::t_block::t_private>_>::
    resize(&this->v_privates,
           (long)(a_privates->
                 super__Vector_base<xemmai::ast::t_block::t_private,_std::allocator<xemmai::ast::t_block::t_private>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
           (long)(a_privates->
                 super__Vector_base<xemmai::ast::t_block::t_private,_std::allocator<xemmai::ast::t_block::t_private>_>
                 )._M_impl.super__Vector_impl_data._M_start >> 2);
  }
  bVar6 = bVar2 ^ 1;
  ptVar3 = (a_privates->
           super__Vector_base<xemmai::ast::t_block::t_private,_std::allocator<xemmai::ast::t_block::t_private>_>
           )._M_impl.super__Vector_impl_data._M_start;
  ptVar4 = (a_privates->
           super__Vector_base<xemmai::ast::t_block::t_private,_std::allocator<xemmai::ast::t_block::t_private>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  ptVar5 = (this->v_privates).
           super__Vector_base<xemmai::ast::t_block::t_private,_std::allocator<xemmai::ast::t_block::t_private>_>
           ._M_impl.super__Vector_impl_data._M_start;
  for (lVar7 = 0; (long)ptVar4 - (long)ptVar3 >> 2 != lVar7; lVar7 = lVar7 + 1) {
    if ((ptVar3[lVar7].v_out == true) && (ptVar5[lVar7].v_in == false)) {
      ptVar1 = ptVar5 + lVar7;
      ptVar1->v_in = true;
      ptVar1->v_out = true;
      bVar6 = 1;
    }
  }
  return (bool)(bVar6 & 1);
}

Assistant:

bool t_block::f_forward(const std::vector<t_private>& a_privates)
{
	bool b = false;
	if (!v_forward) {
		v_forward = b = true;
		v_privates.resize(a_privates.size());
	}
	for (size_t i = 0; i < a_privates.size(); ++i) {
		if (!a_privates[i].v_out) continue;
		auto& x = v_privates[i];
		if (!x.v_in) x.v_in = x.v_out = b = true;
	}
	return b;
}